

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O0

mraa_result_t mraa_led_clear_trigger(mraa_led_context dev)

{
  mraa_result_t mVar1;
  __off_t _Var2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  undefined1 local_19;
  mraa_led_context p_Stack_18;
  char buf [1];
  mraa_led_context dev_local;
  
  local_19 = 0x30;
  p_Stack_18 = dev;
  if (dev == (mraa_led_context)0x0) {
    syslog(3,"led: clear_trigger: context is invalid");
    dev_local._4_4_ = MRAA_ERROR_INVALID_HANDLE;
  }
  else {
    if (dev->trig_fd != -1) {
      close(dev->trig_fd);
      p_Stack_18->trig_fd = -1;
    }
    if (p_Stack_18->max_bright_fd != -1) {
      close(p_Stack_18->max_bright_fd);
      p_Stack_18->max_bright_fd = -1;
    }
    if ((p_Stack_18->bright_fd == -1) &&
       (mVar1 = mraa_led_get_brightfd(p_Stack_18), mVar1 != MRAA_SUCCESS)) {
      dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      _Var2 = lseek(p_Stack_18->bright_fd,0,0);
      if (_Var2 == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        syslog(3,"led: clear_trigger: Failed to lseek \'brightness\': %s",pcVar4);
        dev_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
      }
      else {
        sVar5 = write(p_Stack_18->bright_fd,&local_19,1);
        if (sVar5 == -1) {
          piVar3 = __errno_location();
          pcVar4 = strerror(*piVar3);
          syslog(3,"led: clear_trigger: Failed to write \'brightness\': %s",pcVar4);
          dev_local._4_4_ = MRAA_ERROR_UNSPECIFIED;
        }
        else {
          dev_local._4_4_ = MRAA_SUCCESS;
        }
      }
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_led_clear_trigger(mraa_led_context dev)
{
    char buf[1] = { '0' };

    if (dev == NULL) {
        syslog(LOG_ERR, "led: clear_trigger: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (dev->trig_fd != -1) {
        close(dev->trig_fd);
        dev->trig_fd = -1;
    }

    if (dev->max_bright_fd != -1) {
        close(dev->max_bright_fd);
        dev->max_bright_fd = -1;
    }

    if (dev->bright_fd == -1) {
        if (mraa_led_get_brightfd(dev) != MRAA_SUCCESS) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }

    if (lseek(dev->bright_fd, 0, SEEK_SET) == -1) {
        syslog(LOG_ERR, "led: clear_trigger: Failed to lseek 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }

    /* writing 0 to brightness clears trigger */
    if (write(dev->bright_fd, buf, 1) == -1) {
        syslog(LOG_ERR, "led: clear_trigger: Failed to write 'brightness': %s", strerror(errno));
        return MRAA_ERROR_UNSPECIFIED;
    }

    return MRAA_SUCCESS;
}